

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O0

err_t MATROSKA_LinkBlockWriteTrack(matroska_block *Block,ebml_master *Track,int ForProfile)

{
  ebml_master *peVar1;
  ebml_master *Element;
  ebml_context *peVar2;
  bool_t bVar3;
  ebml_integer *Element_00;
  int64_t iVar4;
  bool_t WasLinked;
  ebml_integer *TrackNum;
  ebml_master *peStack_20;
  int ForProfile_local;
  ebml_master *Track_local;
  matroska_block *Block_local;
  
  peVar1 = Block->WriteTrack;
  peStack_20 = Track;
  Track_local = (ebml_master *)Block;
  peVar2 = MATROSKA_getContextTrackEntry();
  bVar3 = EBML_ElementIsType(&Track->Base,peVar2);
  if (bVar3 == 0) {
    __assert_fail("EBML_ElementIsType((ebml_element*)Track, MATROSKA_getContextTrackEntry())",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x168,"err_t MATROSKA_LinkBlockWriteTrack(matroska_block *, ebml_master *, int)")
    ;
  }
  bVar3 = Node_IsPartOf(Track_local,0x4c424b4d);
  Element = peStack_20;
  if (bVar3 != 0) {
    peVar2 = MATROSKA_getContextTrackNumber();
    Element_00 = (ebml_integer *)EBML_MasterFindFirstElt(Element,peVar2,0,0,0);
    if ((Element_00 == (ebml_integer *)0x0) || ((Element_00->Base).bValueIsSet == '\0')) {
      Block_local = (matroska_block *)0xfffffffffffffffd;
    }
    else {
      iVar4 = EBML_IntegerValue(Element_00);
      *(short *)((long)&Track_local[2].Base.Base.Next + 2) = (short)iVar4;
      if (Track_local == (ebml_master *)0x0) {
        __assert_fail("(const void*)(Block)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                      ,0x16e,
                      "err_t MATROSKA_LinkBlockWriteTrack(matroska_block *, ebml_master *, int)");
      }
      (**(code **)((long)(Track_local->Base).Base.Base.VMT + 0x20))
                (Track_local,0x182,&stack0xffffffffffffffe0,8);
      if (peVar1 == (ebml_master *)0x0) {
        Block_local = (matroska_block *)CheckCompression((matroska_block *)Track_local,ForProfile);
      }
      else {
        Block_local = (matroska_block *)0x0;
      }
    }
    return (err_t)Block_local;
  }
  __assert_fail("Node_IsPartOf(Block,MATROSKA_BLOCK_CLASS)",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                ,0x169,"err_t MATROSKA_LinkBlockWriteTrack(matroska_block *, ebml_master *, int)");
}

Assistant:

err_t MATROSKA_LinkBlockWriteTrack(matroska_block *Block, ebml_master *Track, int ForProfile)
{
    ebml_integer *TrackNum;
    bool_t WasLinked = Block->WriteTrack!=NULL;

    assert(EBML_ElementIsType((ebml_element*)Track, MATROSKA_getContextTrackEntry()));
    assert(Node_IsPartOf(Block,MATROSKA_BLOCK_CLASS));
    TrackNum = (ebml_integer*)EBML_MasterFindChild(Track,MATROSKA_getContextTrackNumber());
    if (TrackNum && ((ebml_element*)TrackNum)->bValueIsSet)
    {
        Block->TrackNumber = (uint16_t)EBML_IntegerValue(TrackNum);
        Node_SET(Block,MATROSKA_BLOCK_WRITE_TRACK,&Track);
        if (WasLinked)
            return ERR_NONE;
        return CheckCompression(Block, ForProfile);
    }
    return ERR_INVALID_DATA;
}